

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::file_prio_alert::~file_prio_alert(file_prio_alert *this)

{
  file_prio_alert *this_local;
  
  torrent_alert::~torrent_alert(&this->super_torrent_alert);
  return;
}

Assistant:

struct TORRENT_EXPORT file_prio_alert final : torrent_alert
	{
		// internal
		explicit file_prio_alert(aux::stack_allocator& alloc, torrent_handle h);
		TORRENT_DEFINE_ALERT(file_prio_alert, 97)

		static constexpr alert_category_t static_category = alert_category::storage;
		std::string message() const override;

		// the error
		error_code error;

		// the operation that failed
		operation_t op;
	}